

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator
fmt::v10::detail::write_codepoint<2ul,char,fmt::v10::detail::counting_iterator>
          (counting_iterator out,char prefix,uint32_t cp)

{
  char buf [2];
  
  buf[0] = '0';
  buf[1] = '0';
  format_uint<4u,char,unsigned_int>(buf,cp,2,false);
  return (counting_iterator)(out.count_ + 4);
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}